

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

string * anon_unknown.dwarf_758de6::ToNativePath(string *__return_storage_ptr__,string *path)

{
  string local_30;
  
  cmSystemTools::ConvertToOutputPath(&local_30,path);
  if (((local_30._M_string_length < 2) || (*local_30._M_dataplus._M_p != '\"')) ||
     (local_30._M_dataplus._M_p[local_30._M_string_length - 1] != '\"')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ToNativePath(const std::string& path)
{
  const auto& outPath = cmSystemTools::ConvertToOutputPath(path);
  if (outPath.size() > 1 && outPath.front() == '\"' &&
      outPath.back() == '\"') {
    return outPath.substr(1, outPath.size() - 2);
  }
  return outPath;
}